

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pprinter.cc
# Opt level: O2

string * __thiscall
tinyusdz::print_typed_attr<std::vector<tinyusdz::Token,std::allocator<tinyusdz::Token>>>
          (string *__return_storage_ptr__,tinyusdz *this,
          TypedAttribute<std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>_> *attr,
          string *name,uint32_t indent)

{
  bool bVar1;
  ostream *poVar2;
  value_type *v;
  string *psVar3;
  long lVar4;
  uint32_t indent_00;
  string *psVar5;
  uint32_t extraout_EDX;
  uint32_t extraout_EDX_00;
  uint32_t uVar6;
  uint32_t n;
  uint32_t extraout_EDX_01;
  optional<std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>_> pv;
  stringstream ss;
  string local_1f8;
  string local_1d8;
  stringstream local_1b8 [16];
  ostream local_1a8 [376];
  
  psVar5 = name;
  std::__cxx11::stringstream::stringstream(local_1b8);
  bVar1 = TypedAttribute<std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>_>::authored
                    ((TypedAttribute<std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>_>
                      *)this);
  if (!bVar1) goto LAB_001deb09;
  bVar1 = AttrMetas::authored((AttrMetas *)this);
  uVar6 = extraout_EDX;
  if ((((bVar1) || (this[0x248] != (tinyusdz)0x0)) || (this[0x228] != (tinyusdz)0x0)) ||
     (bVar1 = TypedAttribute<std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>_>::
              is_value_empty((TypedAttribute<std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>_>
                              *)this), uVar6 = extraout_EDX_00, bVar1)) {
LAB_001de89f:
    indent_00 = (uint32_t)psVar5;
    pprint::Indent_abi_cxx11_(&local_1f8,(pprint *)((ulong)name & 0xffffffff),uVar6);
    std::operator<<(local_1a8,(string *)&local_1f8);
    std::__cxx11::string::_M_dispose();
    std::operator<<(local_1a8,"uniform ");
    value::TypeTraits<std::vector<tinyusdz::Token,std::allocator<tinyusdz::Token>>>::
    type_name_abi_cxx11_();
    poVar2 = std::operator<<(local_1a8,(string *)&local_1f8);
    poVar2 = std::operator<<(poVar2," ");
    std::operator<<(poVar2,(string *)attr);
    std::__cxx11::string::_M_dispose();
    if (this[0x248] == (tinyusdz)0x1) {
      std::operator<<(local_1a8," = None");
    }
    else {
      bVar1 = TypedAttribute<std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>_>::
              is_value_empty((TypedAttribute<std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>_>
                              *)this);
      if (!bVar1) {
        nonstd::optional_lite::
        optional<std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>_>::optional
                  ((optional<std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>_> *)
                   &local_1f8,
                   (optional<std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>_> *)
                   (this + 0x228));
        if ((char)local_1f8._M_dataplus._M_p == '\x01') {
          poVar2 = std::operator<<(local_1a8," = ");
          v = nonstd::optional_lite::
              optional<std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>_>::value
                        ((optional<std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>_>
                          *)&local_1f8);
          std::operator<<(poVar2,v);
        }
        nonstd::optional_lite::
        optional<std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>_>::~optional
                  ((optional<std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>_> *)
                   &local_1f8);
      }
    }
    bVar1 = AttrMetas::authored((AttrMetas *)this);
    if (bVar1) {
      poVar2 = std::operator<<(local_1a8," (\n");
      print_attr_metas_abi_cxx11_(&local_1f8,this,(AttrMeta *)(ulong)((int)name + 1),indent_00);
      poVar2 = std::operator<<(poVar2,(string *)&local_1f8);
      pprint::Indent_abi_cxx11_(&local_1d8,(pprint *)((ulong)name & 0xffffffff),n);
      poVar2 = std::operator<<(poVar2,(string *)&local_1d8);
      std::operator<<(poVar2,")");
      std::__cxx11::string::_M_dispose();
      std::__cxx11::string::_M_dispose();
    }
    std::operator<<(local_1a8,"\n");
    psVar3 = *(string **)(this + 0x210);
    psVar5 = *(string **)(this + 0x218);
    uVar6 = extraout_EDX_01;
  }
  else {
    psVar3 = *(string **)(this + 0x210);
    psVar5 = *(string **)(this + 0x218);
    if ((psVar5 == psVar3) || (((byte)this[0x228] & 1) != 0)) goto LAB_001de89f;
  }
  if (psVar5 != psVar3) {
    pprint::Indent_abi_cxx11_(&local_1f8,(pprint *)((ulong)name & 0xffffffff),uVar6);
    std::operator<<(local_1a8,(string *)&local_1f8);
    std::__cxx11::string::_M_dispose();
    std::operator<<(local_1a8,"uniform ");
    value::TypeTraits<std::vector<tinyusdz::Token,std::allocator<tinyusdz::Token>>>::
    type_name_abi_cxx11_();
    poVar2 = std::operator<<(local_1a8,(string *)&local_1f8);
    poVar2 = std::operator<<(poVar2," ");
    std::operator<<(poVar2,(string *)attr);
    std::__cxx11::string::_M_dispose();
    std::operator<<(local_1a8,".connect = ");
    lVar4 = (*(long *)(this + 0x218) - (long)*(Path **)(this + 0x210)) / 0xd0;
    if (lVar4 == 0) {
      std::operator<<(local_1a8,"[InternalError]");
    }
    else if (lVar4 == 1) {
      std::operator<<(local_1a8,*(Path **)(this + 0x210));
    }
    else {
      std::operator<<(local_1a8,
                      (vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)(this + 0x210));
    }
    std::operator<<(local_1a8,"\n");
  }
LAB_001deb09:
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b8);
  return __return_storage_ptr__;
}

Assistant:

std::string print_typed_attr(const TypedAttribute<T> &attr,
                             const std::string &name, const uint32_t indent) {
  std::stringstream ss;

  if (attr.authored()) {

    if (attr.metas().authored() || attr.is_blocked() || attr.has_value() || attr.is_value_empty() || (!attr.is_connection())) {
      ss << pprint::Indent(indent);
      ss << "uniform ";
      ss << value::TypeTraits<T>::type_name() << " " << name;

      if (attr.is_blocked()) {
        ss << " = None";
      } else if (attr.is_value_empty()) {
        // nothing to do
      } else {
        auto pv = attr.get_value();
        if (pv) {
          ss << " = " << pv.value();
        }
      }

      if (attr.metas().authored()) {
        ss << " (\n"
           << print_attr_metas(attr.metas(), indent + 1) << pprint::Indent(indent)
           << ")";
      }
      ss << "\n";
    }

    if (attr.has_connections()) {
      ss << pprint::Indent(indent);
      ss << "uniform ";
      ss << value::TypeTraits<T>::type_name() << " " << name;
      ss << ".connect = ";

      const std::vector<Path> &paths = attr.get_connections();
      if (paths.size() == 1) {
        ss << paths[0];
      } else if (paths.size() == 0) {
        ss << "[InternalError]";
      } else {
        ss << paths;
      }

      ss << "\n";
    }
  }

  return ss.str();
}